

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

void deqp::gles3::Performance::anon_unknown_1::generateLayeredGridVertexAttribData4C4V
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertexData,
               LayeredGridSpec *scene)

{
  int iVar1;
  reference pvVar2;
  float *local_d8;
  Vector<float,_4> local_c4;
  Vector<float,_4> local_b4;
  Vector<float,_4> local_a4;
  Vector<float,_4> local_94;
  Vector<float,_4> local_84;
  Vector<float,_4> local_74;
  float local_64;
  float local_60;
  float cellBottom;
  float cellTop;
  float cellRight;
  float cellLeft;
  Vec4 color;
  int cellZ;
  int cellX;
  int cellY;
  Vec4 yellow;
  Vec4 green;
  LayeredGridSpec *scene_local;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertexData_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(yellow.m_data + 2),0.0,1.0,0.0,0.7);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cellX,1.0,1.0,0.0,0.8);
  iVar1 = getLayeredGridNumVertices(scene);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (vertexData,(long)(iVar1 << 1));
  for (cellZ = 0; cellZ < scene->gridHeight; cellZ = cellZ + 1) {
    for (color.m_data[3] = 0.0; (int)color.m_data[3] < scene->gridWidth;
        color.m_data[3] = (float)((int)color.m_data[3] + 1)) {
      for (color.m_data[2] = 0.0; (int)color.m_data[2] < scene->gridLayers;
          color.m_data[2] = (float)((int)color.m_data[2] + 1)) {
        if (((int)color.m_data[3] + cellZ + (int)color.m_data[2]) % 2 == 0) {
          local_d8 = yellow.m_data + 2;
        }
        else {
          local_d8 = (float *)&cellX;
        }
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&cellRight,(Vector<float,_4> *)local_d8);
        cellTop = ((float)(int)color.m_data[3] / (float)scene->gridWidth - 0.5) * 2.0;
        cellBottom = ((float)((int)color.m_data[3] + 1) / (float)scene->gridWidth - 0.5) * 2.0;
        local_60 = ((float)(cellZ + 1) / (float)scene->gridHeight - 0.5) * 2.0;
        local_64 = ((float)cellZ / (float)scene->gridHeight - 0.5) * 2.0;
        pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](vertexData,
                            (long)((cellZ * scene->gridWidth * scene->gridLayers +
                                    (int)color.m_data[3] * scene->gridLayers + (int)color.m_data[2])
                                  * 0xc));
        *(undefined8 *)pvVar2->m_data = _cellRight;
        *(undefined8 *)(pvVar2->m_data + 2) = color.m_data._0_8_;
        tcu::Vector<float,_4>::Vector(&local_74,cellTop,local_60,0.0,1.0);
        pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](vertexData,
                            (long)((cellZ * scene->gridWidth * scene->gridLayers +
                                    (int)color.m_data[3] * scene->gridLayers + (int)color.m_data[2])
                                   * 0xc + 1));
        *(undefined8 *)pvVar2->m_data = local_74.m_data._0_8_;
        *(undefined8 *)(pvVar2->m_data + 2) = local_74.m_data._8_8_;
        pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](vertexData,
                            (long)((cellZ * scene->gridWidth * scene->gridLayers +
                                    (int)color.m_data[3] * scene->gridLayers + (int)color.m_data[2])
                                   * 0xc + 2));
        *(undefined8 *)pvVar2->m_data = _cellRight;
        *(undefined8 *)(pvVar2->m_data + 2) = color.m_data._0_8_;
        tcu::Vector<float,_4>::Vector(&local_84,cellTop,local_64,0.0,1.0);
        pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](vertexData,
                            (long)((cellZ * scene->gridWidth * scene->gridLayers +
                                    (int)color.m_data[3] * scene->gridLayers + (int)color.m_data[2])
                                   * 0xc + 3));
        *(undefined8 *)pvVar2->m_data = local_84.m_data._0_8_;
        *(undefined8 *)(pvVar2->m_data + 2) = local_84.m_data._8_8_;
        pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](vertexData,
                            (long)((cellZ * scene->gridWidth * scene->gridLayers +
                                    (int)color.m_data[3] * scene->gridLayers + (int)color.m_data[2])
                                   * 0xc + 4));
        *(undefined8 *)pvVar2->m_data = _cellRight;
        *(undefined8 *)(pvVar2->m_data + 2) = color.m_data._0_8_;
        tcu::Vector<float,_4>::Vector(&local_94,cellBottom,local_64,0.0,1.0);
        pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](vertexData,
                            (long)((cellZ * scene->gridWidth * scene->gridLayers +
                                    (int)color.m_data[3] * scene->gridLayers + (int)color.m_data[2])
                                   * 0xc + 5));
        *(undefined8 *)pvVar2->m_data = local_94.m_data._0_8_;
        *(undefined8 *)(pvVar2->m_data + 2) = local_94.m_data._8_8_;
        pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](vertexData,
                            (long)((cellZ * scene->gridWidth * scene->gridLayers +
                                    (int)color.m_data[3] * scene->gridLayers + (int)color.m_data[2])
                                   * 0xc + 6));
        *(undefined8 *)pvVar2->m_data = _cellRight;
        *(undefined8 *)(pvVar2->m_data + 2) = color.m_data._0_8_;
        tcu::Vector<float,_4>::Vector(&local_a4,cellTop,local_60,0.0,1.0);
        pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](vertexData,
                            (long)((cellZ * scene->gridWidth * scene->gridLayers +
                                    (int)color.m_data[3] * scene->gridLayers + (int)color.m_data[2])
                                   * 0xc + 7));
        *(undefined8 *)pvVar2->m_data = local_a4.m_data._0_8_;
        *(undefined8 *)(pvVar2->m_data + 2) = local_a4.m_data._8_8_;
        pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](vertexData,
                            (long)((cellZ * scene->gridWidth * scene->gridLayers +
                                    (int)color.m_data[3] * scene->gridLayers + (int)color.m_data[2])
                                   * 0xc + 8));
        *(undefined8 *)pvVar2->m_data = _cellRight;
        *(undefined8 *)(pvVar2->m_data + 2) = color.m_data._0_8_;
        tcu::Vector<float,_4>::Vector(&local_b4,cellBottom,local_64,0.0,1.0);
        pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](vertexData,
                            (long)((cellZ * scene->gridWidth * scene->gridLayers +
                                    (int)color.m_data[3] * scene->gridLayers + (int)color.m_data[2])
                                   * 0xc + 9));
        *(undefined8 *)pvVar2->m_data = local_b4.m_data._0_8_;
        *(undefined8 *)(pvVar2->m_data + 2) = local_b4.m_data._8_8_;
        pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](vertexData,
                            (long)((cellZ * scene->gridWidth * scene->gridLayers +
                                    (int)color.m_data[3] * scene->gridLayers + (int)color.m_data[2])
                                   * 0xc + 10));
        *(undefined8 *)pvVar2->m_data = _cellRight;
        *(undefined8 *)(pvVar2->m_data + 2) = color.m_data._0_8_;
        tcu::Vector<float,_4>::Vector(&local_c4,cellBottom,local_60,0.0,1.0);
        pvVar2 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                 operator[](vertexData,
                            (long)((cellZ * scene->gridWidth * scene->gridLayers +
                                    (int)color.m_data[3] * scene->gridLayers + (int)color.m_data[2])
                                   * 0xc + 0xb));
        *(undefined8 *)pvVar2->m_data = local_c4.m_data._0_8_;
        *(undefined8 *)(pvVar2->m_data + 2) = local_c4.m_data._8_8_;
      }
    }
  }
  return;
}

Assistant:

static void generateLayeredGridVertexAttribData4C4V (std::vector<tcu::Vec4>& vertexData, const LayeredGridSpec& scene)
{
	// interleave color & vertex data
	const tcu::Vec4 green	(0.0f, 1.0f, 0.0f, 0.7f);
	const tcu::Vec4 yellow	(1.0f, 1.0f, 0.0f, 0.8f);

	vertexData.resize(getLayeredGridNumVertices(scene) * 2);

	for (int cellY = 0; cellY < scene.gridHeight; ++cellY)
	for (int cellX = 0; cellX < scene.gridWidth; ++cellX)
	for (int cellZ = 0; cellZ < scene.gridLayers; ++cellZ)
	{
		const tcu::Vec4	color		= (((cellX + cellY + cellZ) % 2) == 0) ? (green) : (yellow);
		const float		cellLeft	= (float(cellX  ) / (float)scene.gridWidth  - 0.5f) * 2.0f;
		const float		cellRight	= (float(cellX+1) / (float)scene.gridWidth  - 0.5f) * 2.0f;
		const float		cellTop		= (float(cellY+1) / (float)scene.gridHeight - 0.5f) * 2.0f;
		const float		cellBottom	= (float(cellY  ) / (float)scene.gridHeight - 0.5f) * 2.0f;

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  0] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  1] = tcu::Vec4(cellLeft, cellTop, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  2] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  3] = tcu::Vec4(cellLeft, cellBottom, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  4] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  5] = tcu::Vec4(cellRight, cellBottom, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  6] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  7] = tcu::Vec4(cellLeft, cellTop, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  8] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  9] = tcu::Vec4(cellRight, cellBottom, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 + 10] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 + 11] = tcu::Vec4(cellRight, cellTop, 0.0f, 1.0f);
	}
}